

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::getTargetDimensions
          (LayeredRenderCase *this,LayeredRenderTargetType target)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int iVar1;
  IVec3 IVar2;
  LayeredRenderTargetType target_local;
  
  switch(target) {
  case TARGET_CUBE:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,0);
    iVar1 = extraout_EDX;
    break;
  case TARGET_3D:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,4);
    iVar1 = extraout_EDX_00;
    break;
  case TARGET_1D_ARRAY:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,4,0);
    iVar1 = extraout_EDX_01;
    break;
  case TARGET_2D_ARRAY:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,4);
    iVar1 = extraout_EDX_02;
    break;
  case TARGET_2D_MS_ARRAY:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,2);
    iVar1 = extraout_EDX_03;
    break;
  default:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0,0,0);
    iVar1 = extraout_EDX_04;
  }
  IVar2.m_data[2] = iVar1;
  IVar2.m_data._0_8_ = this;
  return (IVec3)IVar2.m_data;
}

Assistant:

tcu::IVec3 LayeredRenderCase::getTargetDimensions (LayeredRenderTargetType target)
{
	switch (target)
	{
		case TARGET_CUBE:			return tcu::IVec3(64, 64, 0);
		case TARGET_3D:				return tcu::IVec3(64, 64, 4);
		case TARGET_1D_ARRAY:		return tcu::IVec3(64, 4, 0);
		case TARGET_2D_ARRAY:		return tcu::IVec3(64, 64, 4);
		case TARGET_2D_MS_ARRAY:	return tcu::IVec3(64, 64, 2);
		default:
			DE_ASSERT(DE_FALSE);
			return tcu::IVec3(0, 0, 0);
	}
}